

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

void WriteDump(aiScene *scene,FILE *out,char *src,char *cmd,bool shortened)

{
  aiFace *paVar1;
  char cVar2;
  aiTexture *paVar3;
  aiTexel *paVar4;
  aiMaterial *paVar5;
  aiMaterialProperty *paVar6;
  aiAnimation *in;
  aiNodeAnim *in_00;
  aiVectorKey *paVar7;
  aiQuatKey *paVar8;
  aiMesh *this;
  aiBone *in_01;
  aiVector3D *paVar9;
  aiColor4D *paVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  tm *__tp;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  uint y;
  uint uVar19;
  char *pcVar20;
  char *pcVar21;
  uint p;
  ulong uVar22;
  uint n_5;
  uint x;
  ulong uVar23;
  uint a_3;
  ulong uVar24;
  undefined1 auVar25 [16];
  pointer pcVar26;
  undefined8 in_stack_fffffffffffffac8;
  undefined4 uVar27;
  undefined8 in_stack_fffffffffffffad0;
  allocator<char> local_4e1;
  ulong local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8 [16];
  long local_4b8;
  long local_4b0;
  string c;
  time_t tt;
  tm now;
  aiString name;
  
  tt = time((time_t *)0x0);
  __tp = gmtime_r(&tt,(tm *)&now);
  if (__tp == (tm *)0x0) {
    __assert_fail("nullptr != p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/tools/assimp_cmd/WriteDumb.cpp"
                  ,0x36f,"void WriteDump(const aiScene *, FILE *, const char *, const char *, bool)"
                 );
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,cmd,(allocator<char> *)&name);
  while( true ) {
    lVar16 = std::__cxx11::string::find((char *)&c,0x59ec03);
    uVar19 = (uint)((ulong)in_stack_fffffffffffffad0 >> 0x20);
    uVar27 = (undefined4)((ulong)in_stack_fffffffffffffac8 >> 0x20);
    if (lVar16 == -1) break;
    c._M_dataplus._M_p[lVar16] = '?';
  }
  name.length = 0;
  name.data[0] = '\0';
  memset(name.data + 1,0x1b,0x3ff);
  uVar12 = aiGetVersionMajor();
  uVar13 = aiGetVersionMinor();
  uVar14 = aiGetVersionRevision();
  pcVar17 = asctime(__tp);
  fprintf((FILE *)out,
          "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<ASSIMP format_id=\"1\">\n\n<!-- XML Model dump produced by assimp dump\n  Library version: %u.%u.%u\n  Source: %s\n  Command line: %s\n  %s\n--> \n\n<Scene flags=\"%u\" postprocessing=\"%i\">\n"
          ,(ulong)uVar12,(ulong)uVar13,(ulong)uVar14,src,c._M_dataplus._M_p,pcVar17,
          CONCAT44(uVar27,scene->mFlags),(ulong)uVar19 << 0x20);
  WriteNode(scene->mRootNode,out,0);
  pcVar26 = c._M_dataplus._M_p;
  if (scene->mNumTextures != 0) {
    fprintf((FILE *)out,"<TextureList num=\"%u\">\n");
    uVar23 = 0;
    pcVar26 = c._M_dataplus._M_p;
    while (uVar23 < scene->mNumTextures) {
      paVar3 = scene->mTextures[uVar23];
      local_4e0 = uVar23;
      if (paVar3->mHeight == 0) {
        fprintf((FILE *)out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",0xffffffff
                ,0xffffffffffffffff,"true");
        fprintf((FILE *)out,"\t\t<Data length=\"%u\"> \n",(ulong)paVar3->mWidth);
        if (!shortened) {
          iVar15 = 0;
          for (uVar23 = 0; uVar23 < paVar3->mWidth; uVar23 = uVar23 + 1) {
            fprintf((FILE *)out,"\t\t\t%2x",(ulong)(&paVar3->pcData->b)[uVar23]);
            if ((uVar23 != 0) && ((int)((uVar23 & 0xffffffff) / 0x32) * 0x32 + iVar15 == 0)) {
              fputc(10,(FILE *)out);
            }
            iVar15 = iVar15 + -1;
          }
        }
      }
      else {
        fprintf((FILE *)out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",
                (ulong)paVar3->mWidth,(ulong)paVar3->mHeight,"false");
        if (!shortened) {
          fprintf((FILE *)out,"\t\t<Data length=\"%i\"> \n",
                  (ulong)(paVar3->mWidth * paVar3->mHeight * 4));
          for (uVar19 = 0; uVar19 < paVar3->mHeight; uVar19 = uVar19 + 1) {
            for (uVar23 = 0; uVar23 < paVar3->mWidth; uVar23 = uVar23 + 1) {
              uVar12 = paVar3->mWidth * uVar19;
              paVar4 = paVar3->pcData;
              fprintf((FILE *)out,"\t\t\t%2x %2x %2x %2x",(ulong)paVar4[uVar12 + uVar23].r,
                      (ulong)paVar4[uVar12 + uVar23].g,(ulong)paVar4[uVar12 + uVar23].b,
                      (ulong)paVar4[uVar12 + uVar23].a);
              if ((paVar3->mWidth * uVar19 + (int)uVar23 & 3) == 0) {
                fputc(10,(FILE *)out);
              }
            }
          }
        }
      }
      fwrite("\t\t</Data>\n\t</Texture>\n",0x16,1,(FILE *)out);
      uVar23 = local_4e0 + 1;
    }
    fwrite("</TextureList>\n",0xf,1,(FILE *)out);
  }
  if (scene->mNumMaterials != 0) {
    fprintf((FILE *)out,"<MaterialList num=\"%u\">\n");
    uVar23 = 0;
    while (uVar23 < scene->mNumMaterials) {
      paVar5 = scene->mMaterials[uVar23];
      local_4e0 = uVar23;
      fwrite("\t<Material>\n",0xc,1,(FILE *)out);
      fprintf((FILE *)out,"\t\t<MatPropertyList  num=\"%u\">\n",(ulong)paVar5->mNumProperties);
      for (uVar23 = 0; uVar23 < paVar5->mNumProperties; uVar23 = uVar23 + 1) {
        paVar6 = paVar5->mProperties[uVar23];
        uVar19 = paVar6->mType - aiPTI_Float;
        pcVar17 = "";
        if (uVar19 < 5) {
          pcVar17 = &DAT_00596880 + *(int *)(&DAT_00596880 + (ulong)uVar19 * 4);
        }
        pcVar18 = TextureTypeToString(paVar6->mSemantic);
        fprintf((FILE *)out,
                "\t\t\t<MatProperty key=\"%s\" \n\t\t\ttype=\"%s\" tex_usage=\"%s\" tex_index=\"%u\""
                ,(paVar6->mKey).data,pcVar17,pcVar18,(ulong)paVar6->mIndex);
        switch(paVar6->mType) {
        case aiPTI_Float:
          fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)(paVar6->mDataLength >> 2));
          for (uVar22 = 0; uVar22 < paVar6->mDataLength >> 2; uVar22 = uVar22 + 1) {
            fprintf((FILE *)out,"%f ",(double)*(float *)(paVar6->mData + uVar22 * 4));
          }
          break;
        case aiPTI_String:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b8,paVar6->mData + 4,&local_4e1);
          local_4d8 = local_4c8;
          local_4d0 = 0;
          local_4c8[0] = 0;
          std::__cxx11::string::reserve((ulong)&local_4d8);
          for (lVar16 = 0; lVar16 != local_4b0; lVar16 = lVar16 + 1) {
            cVar2 = *(char *)(local_4b8 + lVar16);
            if ((((cVar2 == '\"') || (cVar2 == '>')) || (cVar2 == '\'')) ||
               ((cVar2 == '<' || (cVar2 == '&')))) {
              std::__cxx11::string::append((char *)&local_4d8);
            }
            else {
              std::__cxx11::string::append((char *)&local_4d8,local_4b8 + lVar16);
            }
          }
          fprintf((FILE *)out,">\n\t\t\t\t\"%s\"",local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4b8);
          break;
        case aiPTI_Integer:
          fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)(paVar6->mDataLength >> 2));
          for (uVar22 = 0; uVar22 < paVar6->mDataLength >> 2; uVar22 = uVar22 + 1) {
            fprintf((FILE *)out,"%i ",(ulong)*(uint *)(paVar6->mData + uVar22 * 4));
          }
          break;
        case aiPTI_Buffer:
          iVar15 = 0;
          fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)paVar6->mDataLength);
          for (uVar22 = 0; uVar22 < paVar6->mDataLength; uVar22 = uVar22 + 1) {
            fprintf((FILE *)out,"%2x ",(ulong)(uint)(int)paVar6->mData[uVar22]);
            if ((uVar22 != 0) && ((int)((uVar22 & 0xffffffff) / 0x1e) * 0x1e + iVar15 == 0)) {
              fwrite("\n\t\t\t\t",5,1,(FILE *)out);
            }
            iVar15 = iVar15 + -1;
          }
        }
        fwrite("\n\t\t\t</MatProperty>\n",0x13,1,(FILE *)out);
      }
      fwrite("\t\t</MatPropertyList>\n",0x15,1,(FILE *)out);
      fwrite("\t</Material>\n",0xd,1,(FILE *)out);
      uVar23 = local_4e0 + 1;
    }
    fwrite("</MaterialList>\n",0x10,1,(FILE *)out);
  }
  if (scene->mNumAnimations != 0) {
    fprintf((FILE *)out,"<AnimationList num=\"%u\">\n");
    for (uVar23 = 0; uVar23 < scene->mNumAnimations; uVar23 = uVar23 + 1) {
      in = scene->mAnimations[uVar23];
      ConvertName(&name,&in->mName);
      fprintf((FILE *)out,"\t<Animation name=\"%s\" duration=\"%e\" tick_cnt=\"%e\">\n",
              in->mDuration,in->mTicksPerSecond,name.data);
      if (in->mNumChannels != 0) {
        local_4e0 = uVar23;
        fprintf((FILE *)out,"\t\t<NodeAnimList num=\"%u\">\n");
        for (uVar23 = 0; uVar23 < in->mNumChannels; uVar23 = uVar23 + 1) {
          in_00 = in->mChannels[uVar23];
          ConvertName(&name,&in_00->mNodeName);
          fprintf((FILE *)out,"\t\t\t<NodeAnim node=\"%s\">\n",name.data);
          if (!shortened) {
            if (in_00->mNumPositionKeys != 0) {
              fprintf((FILE *)out,"\t\t\t\t<PositionKeyList num=\"%u\">\n");
              lVar16 = 0x10;
              for (uVar22 = 0; uVar22 < in_00->mNumPositionKeys; uVar22 = uVar22 + 1) {
                paVar7 = in_00->mPositionKeys;
                fprintf((FILE *)out,
                        "\t\t\t\t\t<PositionKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</PositionKey>\n"
                        ,*(undefined8 *)((long)paVar7 + lVar16 + -0x10),
                        (double)*(float *)((long)paVar7 + lVar16 + -8),
                        (double)*(float *)((long)paVar7 + lVar16 + -4),
                        (double)*(float *)((long)&paVar7->mTime + lVar16));
                lVar16 = lVar16 + 0x18;
              }
              fwrite("\t\t\t\t</PositionKeyList>\n",0x17,1,(FILE *)out);
            }
            if (in_00->mNumScalingKeys != 0) {
              fprintf((FILE *)out,"\t\t\t\t<ScalingKeyList num=\"%u\">\n");
              lVar16 = 0x10;
              for (uVar22 = 0; uVar22 < in_00->mNumScalingKeys; uVar22 = uVar22 + 1) {
                paVar7 = in_00->mScalingKeys;
                fprintf((FILE *)out,
                        "\t\t\t\t\t<ScalingKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</ScalingKey>\n"
                        ,*(undefined8 *)((long)paVar7 + lVar16 + -0x10),
                        (double)*(float *)((long)paVar7 + lVar16 + -8),
                        (double)*(float *)((long)paVar7 + lVar16 + -4),
                        (double)*(float *)((long)&paVar7->mTime + lVar16));
                lVar16 = lVar16 + 0x18;
              }
              fwrite("\t\t\t\t</ScalingKeyList>\n",0x16,1,(FILE *)out);
            }
            if (in_00->mNumRotationKeys != 0) {
              fprintf((FILE *)out,"\t\t\t\t<RotationKeyList num=\"%u\">\n");
              lVar16 = 0x14;
              for (uVar22 = 0; uVar22 < in_00->mNumRotationKeys; uVar22 = uVar22 + 1) {
                paVar8 = in_00->mRotationKeys;
                fprintf((FILE *)out,
                        "\t\t\t\t\t<RotationKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f %0 8f\n\t\t\t\t\t</RotationKey>\n"
                        ,*(undefined8 *)((long)paVar8 + lVar16 + -0x14),
                        (double)*(float *)((long)paVar8 + lVar16 + -8),
                        (double)*(float *)((long)paVar8 + lVar16 + -4),
                        (double)*(float *)((long)&paVar8->mTime + lVar16),
                        (double)*(float *)((long)paVar8 + lVar16 + -0xc));
                lVar16 = lVar16 + 0x18;
              }
              fwrite("\t\t\t\t</RotationKeyList>\n",0x17,1,(FILE *)out);
            }
          }
          fwrite("\t\t\t</NodeAnim>\n",0xf,1,(FILE *)out);
        }
        fwrite("\t\t</NodeAnimList>\n",0x12,1,(FILE *)out);
        uVar23 = local_4e0;
      }
      fwrite("\t</Animation>\n",0xe,1,(FILE *)out);
    }
    fwrite("</AnimationList>\n",0x11,1,(FILE *)out);
  }
  if (scene->mNumMeshes != 0) {
    fprintf((FILE *)out,"<MeshList num=\"%u\">\n");
    for (uVar23 = 0; uVar23 < scene->mNumMeshes; uVar23 = uVar23 + 1) {
      this = scene->mMeshes[uVar23];
      uVar19 = this->mPrimitiveTypes;
      auVar25._0_4_ = -(uint)((uVar19 & 8) == 0);
      auVar25._4_4_ = -(uint)((uVar19 & 4) == 0);
      auVar25._8_4_ = -(uint)((uVar19 & 2) == 0);
      auVar25._12_4_ = -(uint)((uVar19 & 1) == 0);
      uVar19 = movmskps((int)scene->mMeshes,auVar25);
      pcVar17 = "points";
      if ((uVar19 & 8) != 0) {
        pcVar17 = "";
      }
      pcVar18 = "lines";
      if ((uVar19 & 4) != 0) {
        pcVar18 = "";
      }
      pcVar20 = "triangles";
      if ((uVar19 & 2) != 0) {
        pcVar20 = "";
      }
      pcVar21 = "polygons";
      if ((uVar19 & 1) != 0) {
        pcVar21 = "";
      }
      pcVar26 = (pointer)CONCAT44((int)((ulong)pcVar26 >> 0x20),this->mMaterialIndex);
      fprintf((FILE *)out,"\t<Mesh types=\"%s %s %s %s\" material_index=\"%u\">\n",pcVar17,pcVar18,
              pcVar20,pcVar21,pcVar26);
      if (this->mNumBones != 0) {
        fprintf((FILE *)out,"\t\t<BoneList num=\"%u\">\n");
        for (uVar22 = 0; uVar22 < this->mNumBones; uVar22 = uVar22 + 1) {
          in_01 = this->mBones[uVar22];
          ConvertName(&name,&in_01->mName);
          pcVar26 = (pointer)(double)(in_01->mOffsetMatrix).c1;
          fprintf((FILE *)out,
                  "\t\t\t<Bone name=\"%s\">\n\t\t\t\t<Matrix4> \n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t</Matrix4> \n"
                  ,(double)(in_01->mOffsetMatrix).a1,(double)(in_01->mOffsetMatrix).a2,
                  (double)(in_01->mOffsetMatrix).a3,(double)(in_01->mOffsetMatrix).a4,
                  (double)(in_01->mOffsetMatrix).b1,(double)(in_01->mOffsetMatrix).b2,
                  (double)(in_01->mOffsetMatrix).b3,(double)(in_01->mOffsetMatrix).b4,name.data);
          if ((!shortened) && (in_01->mNumWeights != 0)) {
            fprintf((FILE *)out,"\t\t\t\t<WeightList num=\"%u\">\n");
            for (uVar24 = 0; uVar24 < in_01->mNumWeights; uVar24 = uVar24 + 1) {
              fprintf((FILE *)out,
                      "\t\t\t\t\t<Weight index=\"%u\">\n\t\t\t\t\t\t%f\n\t\t\t\t\t</Weight>\n",
                      (double)in_01->mWeights[uVar24].mWeight,
                      (ulong)in_01->mWeights[uVar24].mVertexId);
            }
            fwrite("\t\t\t\t</WeightList>\n",0x12,1,(FILE *)out);
          }
          fwrite("\t\t\t</Bone>\n",0xb,1,(FILE *)out);
        }
        fwrite("\t\t</BoneList>\n",0xe,1,(FILE *)out);
      }
      if ((!shortened) && (this->mNumFaces != 0)) {
        fprintf((FILE *)out,"\t\t<FaceList num=\"%u\">\n");
        for (uVar22 = 0; uVar22 < this->mNumFaces; uVar22 = uVar22 + 1) {
          paVar1 = this->mFaces + uVar22;
          fprintf((FILE *)out,"\t\t\t<Face num=\"%u\">\n\t\t\t\t",
                  (ulong)this->mFaces[uVar22].mNumIndices);
          for (uVar24 = 0; uVar24 < paVar1->mNumIndices; uVar24 = uVar24 + 1) {
            fprintf((FILE *)out,"%u ",(ulong)paVar1->mIndices[uVar24]);
          }
          fwrite("\n\t\t\t</Face>\n",0xc,1,(FILE *)out);
        }
        fwrite("\t\t</FaceList>\n",0xe,1,(FILE *)out);
      }
      uVar19 = this->mNumVertices;
      if (uVar19 != 0 && this->mVertices != (aiVector3D *)0x0) {
        fprintf((FILE *)out,"\t\t<Positions num=\"%u\" set=\"0\" num_components=\"3\"> \n");
        if (!shortened) {
          lVar16 = 8;
          for (uVar22 = 0; uVar22 < this->mNumVertices; uVar22 = uVar22 + 1) {
            paVar9 = this->mVertices;
            fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                    (double)*(float *)((long)paVar9 + lVar16 + -8),
                    (double)*(float *)((long)paVar9 + lVar16 + -4),
                    (double)*(float *)((long)&paVar9->x + lVar16));
            lVar16 = lVar16 + 0xc;
          }
        }
        fwrite("\t\t</Positions>\n",0xf,1,(FILE *)out);
        uVar19 = this->mNumVertices;
      }
      if (uVar19 != 0 && this->mNormals != (aiVector3D *)0x0) {
        fprintf((FILE *)out,"\t\t<Normals num=\"%u\" set=\"0\" num_components=\"3\"> \n");
        if (!shortened) {
          lVar16 = 8;
          for (uVar22 = 0; uVar22 < this->mNumVertices; uVar22 = uVar22 + 1) {
            paVar9 = this->mNormals;
            fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                    (double)*(float *)((long)paVar9 + lVar16 + -8),
                    (double)*(float *)((long)paVar9 + lVar16 + -4),
                    (double)*(float *)((long)&paVar9->x + lVar16));
            lVar16 = lVar16 + 0xc;
          }
        }
        fwrite("\t\t</Normals>\n",0xd,1,(FILE *)out);
      }
      bVar11 = aiMesh::HasTangentsAndBitangents(this);
      if (bVar11) {
        fprintf((FILE *)out,"\t\t<Tangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                (ulong)this->mNumVertices);
        if (shortened) {
          fwrite("\t\t</Tangents>\n",0xe,1,(FILE *)out);
          fprintf((FILE *)out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                  (ulong)this->mNumVertices);
        }
        else {
          lVar16 = 8;
          for (uVar22 = 0; uVar22 < this->mNumVertices; uVar22 = uVar22 + 1) {
            paVar9 = this->mTangents;
            fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                    (double)*(float *)((long)paVar9 + lVar16 + -8),
                    (double)*(float *)((long)paVar9 + lVar16 + -4),
                    (double)*(float *)((long)&paVar9->x + lVar16));
            lVar16 = lVar16 + 0xc;
          }
          fwrite("\t\t</Tangents>\n",0xe,1,(FILE *)out);
          fprintf((FILE *)out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                  (ulong)this->mNumVertices);
          lVar16 = 8;
          for (uVar22 = 0; uVar22 < this->mNumVertices; uVar22 = uVar22 + 1) {
            paVar9 = this->mBitangents;
            fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                    (double)*(float *)((long)paVar9 + lVar16 + -8),
                    (double)*(float *)((long)paVar9 + lVar16 + -4),
                    (double)*(float *)((long)&paVar9->x + lVar16));
            lVar16 = lVar16 + 0xc;
          }
        }
        fwrite("\t\t</Bitangents>\n",0x10,1,(FILE *)out);
      }
      for (uVar22 = 0; (uVar22 != 8 && (this->mTextureCoords[uVar22] != (aiVector3D *)0x0));
          uVar22 = uVar22 + 1) {
        fprintf((FILE *)out,"\t\t<TextureCoords num=\"%u\" set=\"%u\" num_components=\"%u\"> \n",
                (ulong)this->mNumVertices,uVar22 & 0xffffffff,(ulong)this->mNumUVComponents[uVar22])
        ;
        if (!shortened) {
          if (this->mNumUVComponents[uVar22] == 3) {
            lVar16 = 8;
            for (uVar24 = 0; uVar24 < this->mNumVertices; uVar24 = uVar24 + 1) {
              paVar9 = this->mTextureCoords[uVar22];
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                      (double)*(float *)((long)paVar9 + lVar16 + -8),
                      (double)*(float *)((long)paVar9 + lVar16 + -4),
                      (double)*(float *)((long)&paVar9->x + lVar16));
              lVar16 = lVar16 + 0xc;
            }
          }
          else {
            lVar16 = 4;
            for (uVar24 = 0; uVar24 < this->mNumVertices; uVar24 = uVar24 + 1) {
              fprintf((FILE *)out,"\t\t%0 8f %0 8f\n",
                      (double)*(float *)((long)this->mTextureCoords[uVar22] + lVar16 + -4),
                      (double)*(float *)((long)&this->mTextureCoords[uVar22]->x + lVar16));
              lVar16 = lVar16 + 0xc;
            }
          }
        }
        fwrite("\t\t</TextureCoords>\n",0x13,1,(FILE *)out);
      }
      for (uVar22 = 0; (uVar22 != 8 && (this->mColors[uVar22] != (aiColor4D *)0x0));
          uVar22 = uVar22 + 1) {
        fprintf((FILE *)out,"\t\t<Colors num=\"%u\" set=\"%u\" num_components=\"4\"> \n",
                (ulong)this->mNumVertices,uVar22 & 0xffffffff);
        if (!shortened) {
          lVar16 = 0xc;
          for (uVar24 = 0; uVar24 < this->mNumVertices; uVar24 = uVar24 + 1) {
            paVar10 = this->mColors[uVar22];
            fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f %0 8f\n",
                    (double)*(float *)((long)paVar10 + lVar16 + -0xc),
                    (double)*(float *)((long)paVar10 + lVar16 + -8),
                    (double)*(float *)((long)paVar10 + lVar16 + -4),
                    (double)*(float *)((long)&paVar10->r + lVar16));
            lVar16 = lVar16 + 0x10;
          }
        }
        fwrite("\t\t</Colors>\n",0xc,1,(FILE *)out);
      }
      fwrite("\t</Mesh>\n",9,1,(FILE *)out);
    }
    fwrite("</MeshList>\n",0xc,1,(FILE *)out);
  }
  fwrite("</Scene>\n</ASSIMP>",0x12,1,(FILE *)out);
  std::__cxx11::string::~string((string *)&c);
  return;
}

Assistant:

void WriteDump(const aiScene* scene, FILE* out, const char* src, const char* cmd, bool shortened)
{
	time_t tt = ::time(NULL);
#if _WIN32
    tm* p = gmtime(&tt);
#else
    struct tm now;
    tm* p = gmtime_r(&tt, &now);
#endif
    ai_assert(nullptr != p);

	std::string c = cmd;
	std::string::size_type s; 

	// https://sourceforge.net/tracker/?func=detail&aid=3167364&group_id=226462&atid=1067632
	// -- not allowed in XML comments
	while((s = c.find("--")) != std::string::npos) {
		c[s] = '?';
	}
	aiString name;

	// write header
	fprintf(out,
		"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
		"<ASSIMP format_id=\"1\">\n\n"

		"<!-- XML Model dump produced by assimp dump\n"
		"  Library version: %u.%u.%u\n"
		"  Source: %s\n"
		"  Command line: %s\n"
		"  %s\n"
		"-->"
		" \n\n"
		"<Scene flags=\"%u\" postprocessing=\"%i\">\n",
		
		aiGetVersionMajor(),aiGetVersionMinor(),aiGetVersionRevision(),src,c.c_str(),asctime(p),
		scene->mFlags,
		0 /*globalImporter->GetEffectivePostProcessing()*/);

	// write the node graph
	WriteNode(scene->mRootNode, out, 0);

#if 0
		// write cameras
	for (unsigned int i = 0; i < scene->mNumCameras;++i) {
		aiCamera* cam  = scene->mCameras[i];
		ConvertName(name,cam->mName);

		// camera header
		fprintf(out,"\t<Camera parent=\"%s\">\n"
			"\t\t<Vector3 name=\"up\"        > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"lookat\"    > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"pos\"       > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Float   name=\"fov\"       > %f </Float>\n"
			"\t\t<Float   name=\"aspect\"    > %f </Float>\n"
			"\t\t<Float   name=\"near_clip\" > %f </Float>\n"
			"\t\t<Float   name=\"far_clip\"  > %f </Float>\n"
			"\t</Camera>\n",
			name.data,
			cam->mUp.x,cam->mUp.y,cam->mUp.z,
			cam->mLookAt.x,cam->mLookAt.y,cam->mLookAt.z,
			cam->mPosition.x,cam->mPosition.y,cam->mPosition.z,
			cam->mHorizontalFOV,cam->mAspect,cam->mClipPlaneNear,cam->mClipPlaneFar,i);
	}

	// write lights
	for (unsigned int i = 0; i < scene->mNumLights;++i) {
		aiLight* l  = scene->mLights[i];
		ConvertName(name,l->mName);

		// light header
		fprintf(out,"\t<Light parent=\"%s\"> type=\"%s\"\n"
			"\t\t<Vector3 name=\"diffuse\"   > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"specular\"  > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"ambient\"   > %0 8f %0 8f %0 8f </Vector3>\n",
			name.data,
			(l->mType == aiLightSource_DIRECTIONAL ? "directional" :
			(l->mType == aiLightSource_POINT ? "point" : "spot" )),
			l->mColorDiffuse.r, l->mColorDiffuse.g, l->mColorDiffuse.b,
			l->mColorSpecular.r,l->mColorSpecular.g,l->mColorSpecular.b,
			l->mColorAmbient.r, l->mColorAmbient.g, l->mColorAmbient.b);

		if (l->mType != aiLightSource_DIRECTIONAL) {
			fprintf(out,
				"\t\t<Vector3 name=\"pos\"       > %0 8f %0 8f %0 8f </Vector3>\n"
				"\t\t<Float   name=\"atten_cst\" > %f </Float>\n"
				"\t\t<Float   name=\"atten_lin\" > %f </Float>\n"
				"\t\t<Float   name=\"atten_sqr\" > %f </Float>\n",
				l->mPosition.x,l->mPosition.y,l->mPosition.z,
				l->mAttenuationConstant,l->mAttenuationLinear,l->mAttenuationQuadratic);
		}

		if (l->mType != aiLightSource_POINT) {
			fprintf(out,
				"\t\t<Vector3 name=\"lookat\"    > %0 8f %0 8f %0 8f </Vector3>\n",
				l->mDirection.x,l->mDirection.y,l->mDirection.z);
		}

		if (l->mType == aiLightSource_SPOT) {
			fprintf(out,
				"\t\t<Float   name=\"cone_out\" > %f </Float>\n"
				"\t\t<Float   name=\"cone_inn\" > %f </Float>\n",
				l->mAngleOuterCone,l->mAngleInnerCone);
		}
		fprintf(out,"\t</Light>\n");
	}
#endif

	// write textures
	if (scene->mNumTextures) {
		fprintf(out,"<TextureList num=\"%u\">\n",scene->mNumTextures);
		for (unsigned int i = 0; i < scene->mNumTextures;++i) {
			aiTexture* tex  = scene->mTextures[i];
			bool compressed = (tex->mHeight == 0);

			// mesh header
			fprintf(out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",
				(compressed ? -1 : tex->mWidth),(compressed ? -1 : tex->mHeight),
				(compressed ? "true" : "false"));

			if (compressed) {
				fprintf(out,"\t\t<Data length=\"%u\"> \n",tex->mWidth);

				if (!shortened) {
					for (unsigned int n = 0; n < tex->mWidth;++n) {
						fprintf(out,"\t\t\t%2x",reinterpret_cast<uint8_t*>(tex->pcData)[n]);
						if (n && !(n % 50)) {
							fprintf(out,"\n");
						}
					}
				}
			}
			else if (!shortened){
				fprintf(out,"\t\t<Data length=\"%i\"> \n",tex->mWidth*tex->mHeight*4);

				// const unsigned int width = (unsigned int)log10((double)std::max(tex->mHeight,tex->mWidth))+1;
				for (unsigned int y = 0; y < tex->mHeight;++y) {
					for (unsigned int x = 0; x < tex->mWidth;++x) {
						aiTexel* tx = tex->pcData + y*tex->mWidth+x;
						unsigned int r = tx->r,g=tx->g,b=tx->b,a=tx->a;
						fprintf(out,"\t\t\t%2x %2x %2x %2x",r,g,b,a);

						// group by four for readibility
						if (0 == (x+y*tex->mWidth) % 4)
							fprintf(out,"\n");
					}
				}
			}
			fprintf(out,"\t\t</Data>\n\t</Texture>\n");
		}
		fprintf(out,"</TextureList>\n");
	}

	// write materials
	if (scene->mNumMaterials) {
		fprintf(out,"<MaterialList num=\"%u\">\n",scene->mNumMaterials);
		for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
			const aiMaterial* mat = scene->mMaterials[i];

			fprintf(out,"\t<Material>\n");
			fprintf(out,"\t\t<MatPropertyList  num=\"%u\">\n",mat->mNumProperties);
			for (unsigned int n = 0; n < mat->mNumProperties;++n) {

				const aiMaterialProperty* prop = mat->mProperties[n];
				const char* sz = "";
				if (prop->mType == aiPTI_Float) {
					sz = "float";
				}
				else if (prop->mType == aiPTI_Integer) {
					sz = "integer";
				}
				else if (prop->mType == aiPTI_String) {
					sz = "string";
				}
				else if (prop->mType == aiPTI_Buffer) {
					sz = "binary_buffer";
				}

				fprintf(out,"\t\t\t<MatProperty key=\"%s\" \n\t\t\ttype=\"%s\" tex_usage=\"%s\" tex_index=\"%u\"",
					prop->mKey.data, sz,
					::TextureTypeToString((aiTextureType)prop->mSemantic),prop->mIndex);

				if (prop->mType == aiPTI_Float) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength/sizeof(float)));

					for (unsigned int p = 0; p < prop->mDataLength/sizeof(float);++p) {
						fprintf(out,"%f ",*((float*)(prop->mData+p*sizeof(float))));
					}
				}
				else if (prop->mType == aiPTI_Integer) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength/sizeof(int)));

					for (unsigned int p = 0; p < prop->mDataLength/sizeof(int);++p) {
						fprintf(out,"%i ",*((int*)(prop->mData+p*sizeof(int))));
					}
				}
				else if (prop->mType == aiPTI_Buffer) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength));

					for (unsigned int p = 0; p < prop->mDataLength;++p) {
						fprintf(out,"%2x ",prop->mData[p]);
						if (p && 0 == p%30) {
							fprintf(out,"\n\t\t\t\t");
						}
					}
				}
				else if (prop->mType == aiPTI_String) {
					fprintf(out,">\n\t\t\t\t\"%s\"",encodeXML(prop->mData+4).c_str() /* skip length */);
				}
				fprintf(out,"\n\t\t\t</MatProperty>\n");
			}
			fprintf(out,"\t\t</MatPropertyList>\n");
			fprintf(out,"\t</Material>\n");
		}
		fprintf(out,"</MaterialList>\n");
	}

	// write animations
	if (scene->mNumAnimations) {
		fprintf(out,"<AnimationList num=\"%u\">\n",scene->mNumAnimations);
		for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
			aiAnimation* anim = scene->mAnimations[i];

			// anim header
			ConvertName(name,anim->mName);
			fprintf(out,"\t<Animation name=\"%s\" duration=\"%e\" tick_cnt=\"%e\">\n",
				name.data, anim->mDuration, anim->mTicksPerSecond);

			// write bone animation channels
			if (anim->mNumChannels) {
				fprintf(out,"\t\t<NodeAnimList num=\"%u\">\n",anim->mNumChannels);
				for (unsigned int n = 0; n < anim->mNumChannels;++n) {
					aiNodeAnim* nd = anim->mChannels[n];

					// node anim header
					ConvertName(name,nd->mNodeName);
					fprintf(out,"\t\t\t<NodeAnim node=\"%s\">\n",name.data);

					if (!shortened) {
						// write position keys
						if (nd->mNumPositionKeys) {
							fprintf(out,"\t\t\t\t<PositionKeyList num=\"%u\">\n",nd->mNumPositionKeys);
							for (unsigned int a = 0; a < nd->mNumPositionKeys;++a) {
								aiVectorKey* vc = nd->mPositionKeys+a;
								fprintf(out,"\t\t\t\t\t<PositionKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</PositionKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z);
							}
							fprintf(out,"\t\t\t\t</PositionKeyList>\n");
						}

						// write scaling keys
						if (nd->mNumScalingKeys) {
							fprintf(out,"\t\t\t\t<ScalingKeyList num=\"%u\">\n",nd->mNumScalingKeys);
							for (unsigned int a = 0; a < nd->mNumScalingKeys;++a) {
								aiVectorKey* vc = nd->mScalingKeys+a;
								fprintf(out,"\t\t\t\t\t<ScalingKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</ScalingKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z);
							}
							fprintf(out,"\t\t\t\t</ScalingKeyList>\n");
						}

						// write rotation keys
						if (nd->mNumRotationKeys) {
							fprintf(out,"\t\t\t\t<RotationKeyList num=\"%u\">\n",nd->mNumRotationKeys);
							for (unsigned int a = 0; a < nd->mNumRotationKeys;++a) {
								aiQuatKey* vc = nd->mRotationKeys+a;
								fprintf(out,"\t\t\t\t\t<RotationKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f %0 8f\n\t\t\t\t\t</RotationKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z,vc->mValue.w);
							}
							fprintf(out,"\t\t\t\t</RotationKeyList>\n");
						}
					}
					fprintf(out,"\t\t\t</NodeAnim>\n");
				}
				fprintf(out,"\t\t</NodeAnimList>\n");
			}
			fprintf(out,"\t</Animation>\n");
		}
		fprintf(out,"</AnimationList>\n");
	}

	// write meshes
	if (scene->mNumMeshes) {
		fprintf(out,"<MeshList num=\"%u\">\n",scene->mNumMeshes);
		for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
			aiMesh* mesh = scene->mMeshes[i];
			// const unsigned int width = (unsigned int)log10((double)mesh->mNumVertices)+1;

			// mesh header
			fprintf(out,"\t<Mesh types=\"%s %s %s %s\" material_index=\"%u\">\n",
				(mesh->mPrimitiveTypes & aiPrimitiveType_POINT    ? "points"    : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_LINE     ? "lines"     : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_TRIANGLE ? "triangles" : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_POLYGON  ? "polygons"  : ""),
				mesh->mMaterialIndex);

			// bones
			if (mesh->mNumBones) {
				fprintf(out,"\t\t<BoneList num=\"%u\">\n",mesh->mNumBones);

				for (unsigned int n = 0; n < mesh->mNumBones;++n) {
					aiBone* bone = mesh->mBones[n];

					ConvertName(name,bone->mName);
					// bone header
					fprintf(out,"\t\t\t<Bone name=\"%s\">\n"
						"\t\t\t\t<Matrix4> \n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t</Matrix4> \n",
						name.data,
						bone->mOffsetMatrix.a1,bone->mOffsetMatrix.a2,bone->mOffsetMatrix.a3,bone->mOffsetMatrix.a4,
						bone->mOffsetMatrix.b1,bone->mOffsetMatrix.b2,bone->mOffsetMatrix.b3,bone->mOffsetMatrix.b4,
						bone->mOffsetMatrix.c1,bone->mOffsetMatrix.c2,bone->mOffsetMatrix.c3,bone->mOffsetMatrix.c4,
						bone->mOffsetMatrix.d1,bone->mOffsetMatrix.d2,bone->mOffsetMatrix.d3,bone->mOffsetMatrix.d4);

					if (!shortened && bone->mNumWeights) {
						fprintf(out,"\t\t\t\t<WeightList num=\"%u\">\n",bone->mNumWeights);

						// bone weights
						for (unsigned int a = 0; a < bone->mNumWeights;++a) {
							aiVertexWeight* wght = bone->mWeights+a;

							fprintf(out,"\t\t\t\t\t<Weight index=\"%u\">\n\t\t\t\t\t\t%f\n\t\t\t\t\t</Weight>\n",
								wght->mVertexId,wght->mWeight);
						}
						fprintf(out,"\t\t\t\t</WeightList>\n");
					}
					fprintf(out,"\t\t\t</Bone>\n");
				}
				fprintf(out,"\t\t</BoneList>\n");
			}

			// faces
			if (!shortened && mesh->mNumFaces) {
				fprintf(out,"\t\t<FaceList num=\"%u\">\n",mesh->mNumFaces);
				for (unsigned int n = 0; n < mesh->mNumFaces; ++n) {
					aiFace& f = mesh->mFaces[n];
					fprintf(out,"\t\t\t<Face num=\"%u\">\n"
						"\t\t\t\t",f.mNumIndices);

					for (unsigned int j = 0; j < f.mNumIndices;++j)
						fprintf(out,"%u ",f.mIndices[j]);

					fprintf(out,"\n\t\t\t</Face>\n");
				}
				fprintf(out,"\t\t</FaceList>\n");
			}

			// vertex positions
			if (mesh->HasPositions()) {
				fprintf(out,"\t\t<Positions num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mVertices[n].x,
							mesh->mVertices[n].y,
							mesh->mVertices[n].z);
					}
				}
				fprintf(out,"\t\t</Positions>\n");
			}

			// vertex normals
			if (mesh->HasNormals()) {
				fprintf(out,"\t\t<Normals num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mNormals[n].x,
							mesh->mNormals[n].y,
							mesh->mNormals[n].z);
					}
				}
				else {
				}
				fprintf(out,"\t\t</Normals>\n");
			}

			// vertex tangents and bitangents
			if (mesh->HasTangentsAndBitangents()) {
				fprintf(out,"\t\t<Tangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mTangents[n].x,
							mesh->mTangents[n].y,
							mesh->mTangents[n].z);
					}
				}
				fprintf(out,"\t\t</Tangents>\n");

				fprintf(out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mBitangents[n].x,
							mesh->mBitangents[n].y,
							mesh->mBitangents[n].z);
					}
				}
				fprintf(out,"\t\t</Bitangents>\n");
			}

			// texture coordinates
			for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
				if (!mesh->mTextureCoords[a])
					break;

				fprintf(out,"\t\t<TextureCoords num=\"%u\" set=\"%u\" num_components=\"%u\"> \n",mesh->mNumVertices,
					a,mesh->mNumUVComponents[a]);
				
				if (!shortened) {
					if (mesh->mNumUVComponents[a] == 3) {
						for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
							fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
								mesh->mTextureCoords[a][n].x,
								mesh->mTextureCoords[a][n].y,
								mesh->mTextureCoords[a][n].z);
						}
					}
					else {
						for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
							fprintf(out,"\t\t%0 8f %0 8f\n",
								mesh->mTextureCoords[a][n].x,
								mesh->mTextureCoords[a][n].y);
						}
					}
				}
				fprintf(out,"\t\t</TextureCoords>\n");
			}

			// vertex colors
			for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
				if (!mesh->mColors[a])
					break;
				fprintf(out,"\t\t<Colors num=\"%u\" set=\"%u\" num_components=\"4\"> \n",mesh->mNumVertices,a);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f %0 8f\n",
							mesh->mColors[a][n].r,
							mesh->mColors[a][n].g,
							mesh->mColors[a][n].b,
							mesh->mColors[a][n].a);
					}
				}
				fprintf(out,"\t\t</Colors>\n");
			}
			fprintf(out,"\t</Mesh>\n");
		}
		fprintf(out,"</MeshList>\n");
	}
	fprintf(out,"</Scene>\n</ASSIMP>");
}